

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aperiodicity.cc
# Opt level: O0

void sptk::world::anon_unknown_1::SetInternalParameters
               (int segment_length,int n_margin,InternalParameters *internal_parameters)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ulong uVar17;
  void *pvVar18;
  int *in_RDX;
  int in_ESI;
  int in_EDI;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  *in_RDX = in_EDI;
  in_RDX[1] = in_ESI;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_EDI;
  uVar17 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pvVar18 = operator_new__(uVar17);
  *(void **)(in_RDX + 2) = pvVar18;
  for (local_14 = 0; local_14 < in_EDI; local_14 = local_14 + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)in_EDI;
    uVar17 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar17 = 0xffffffffffffffff;
    }
    pvVar18 = operator_new__(uVar17);
    *(void **)(*(long *)(in_RDX + 2) + (long)local_14 * 8) = pvVar18;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)in_EDI;
  uVar17 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pvVar18 = operator_new__(uVar17);
  *(void **)(in_RDX + 4) = pvVar18;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)in_EDI;
  uVar17 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pvVar18 = operator_new__(uVar17);
  *(void **)(in_RDX + 6) = pvVar18;
  for (local_18 = 0; local_18 < in_EDI; local_18 = local_18 + 1) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)(in_ESI << 1);
    uVar17 = SUB168(auVar5 * ZEXT816(8),0);
    if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
      uVar17 = 0xffffffffffffffff;
    }
    pvVar18 = operator_new__(uVar17);
    *(void **)(*(long *)(in_RDX + 6) + (long)local_18 * 8) = pvVar18;
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)(in_ESI << 1);
  uVar17 = SUB168(auVar6 * ZEXT816(8),0);
  if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pvVar18 = operator_new__(uVar17);
  *(void **)(in_RDX + 8) = pvVar18;
  for (local_1c = 0; SBORROW4(local_1c,in_ESI * 2) != local_1c + in_ESI * -2 < 0;
      local_1c = local_1c + 1) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (long)in_EDI;
    uVar17 = SUB168(auVar7 * ZEXT816(8),0);
    if (SUB168(auVar7 * ZEXT816(8),8) != 0) {
      uVar17 = 0xffffffffffffffff;
    }
    pvVar18 = operator_new__(uVar17);
    memset(pvVar18,0,uVar17);
    *(void **)(*(long *)(in_RDX + 8) + (long)local_1c * 8) = pvVar18;
  }
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (long)(in_ESI << 1);
  uVar17 = SUB168(auVar8 * ZEXT816(8),0);
  if (SUB168(auVar8 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pvVar18 = operator_new__(uVar17);
  *(void **)(in_RDX + 10) = pvVar18;
  for (local_20 = 0; SBORROW4(local_20,in_ESI * 2) != local_20 + in_ESI * -2 < 0;
      local_20 = local_20 + 1) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (long)(in_ESI << 1);
    uVar17 = SUB168(auVar9 * ZEXT816(8),0);
    if (SUB168(auVar9 * ZEXT816(8),8) != 0) {
      uVar17 = 0xffffffffffffffff;
    }
    pvVar18 = operator_new__(uVar17);
    *(void **)(*(long *)(in_RDX + 10) + (long)local_20 * 8) = pvVar18;
  }
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (long)(in_ESI << 1);
  uVar17 = SUB168(auVar10 * ZEXT816(8),0);
  if (SUB168(auVar10 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pvVar18 = operator_new__(uVar17);
  *(void **)(in_RDX + 0xc) = pvVar18;
  for (local_24 = 0; SBORROW4(local_24,in_ESI * 2) != local_24 + in_ESI * -2 < 0;
      local_24 = local_24 + 1) {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = (long)(in_ESI << 1);
    uVar17 = SUB168(auVar11 * ZEXT816(8),0);
    if (SUB168(auVar11 * ZEXT816(8),8) != 0) {
      uVar17 = 0xffffffffffffffff;
    }
    pvVar18 = operator_new__(uVar17);
    *(void **)(*(long *)(in_RDX + 0xc) + (long)local_24 * 8) = pvVar18;
  }
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (long)(in_ESI << 1);
  uVar17 = SUB168(auVar12 * ZEXT816(8),0);
  if (SUB168(auVar12 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pvVar18 = operator_new__(uVar17);
  *(void **)(in_RDX + 0xe) = pvVar18;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (long)(in_ESI << 1);
  uVar17 = SUB168(auVar13 * ZEXT816(8),0);
  if (SUB168(auVar13 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pvVar18 = operator_new__(uVar17);
  *(void **)(in_RDX + 0x10) = pvVar18;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (long)in_EDI;
  uVar17 = SUB168(auVar14 * ZEXT816(8),0);
  if (SUB168(auVar14 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pvVar18 = operator_new__(uVar17);
  *(void **)(in_RDX + 0x12) = pvVar18;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = (long)in_EDI;
  uVar17 = SUB168(auVar15 * ZEXT816(8),0);
  if (SUB168(auVar15 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pvVar18 = operator_new__(uVar17);
  *(void **)(in_RDX + 0x14) = pvVar18;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = (long)in_EDI;
  uVar17 = SUB168(auVar16 * ZEXT816(8),0);
  if (SUB168(auVar16 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pvVar18 = operator_new__(uVar17);
  *(void **)(in_RDX + 0x16) = pvVar18;
  return;
}

Assistant:

void SetInternalParameters(int segment_length, int n_margin,
    InternalParameters *internal_parameters) {
  internal_parameters->segmentLength = segment_length;
  internal_parameters->nMargin = n_margin;
  internal_parameters->w = new double *[segment_length];
  for (int i = 0; i < segment_length; ++i)
    internal_parameters->w[i] = new double[segment_length];
  internal_parameters->wsqrt = new double[segment_length];
  internal_parameters->H = new double *[segment_length];
  for (int i = 0; i < segment_length; ++i)
    internal_parameters->H[i] = new double[n_margin * 2];
  internal_parameters->Hw = new double *[n_margin * 2];
  for (int i = 0; i < n_margin * 2; ++i)
#if 0
    internal_parameters->Hw[i] = new double[segment_length];
#else
    internal_parameters->Hw[i] = new double[segment_length]();
#endif
  internal_parameters->R = new double *[n_margin * 2];
  for (int i = 0; i < n_margin * 2; ++i)
    internal_parameters->R[i] = new double[n_margin * 2];
  internal_parameters->invR = new double *[n_margin * 2];
  for (int i = 0; i < n_margin * 2; ++i)
    internal_parameters->invR[i] = new double[n_margin * 2];
  internal_parameters->Hwx = new double[n_margin * 2];
  internal_parameters->a = new double[n_margin * 2];
  internal_parameters->Ha = new double[segment_length];
  internal_parameters->wxHa = new double[segment_length];
  internal_parameters->wx = new double[segment_length];
}